

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

int Sbd_CutMergeOrder(Sbd_Cut_t *pCut0,Sbd_Cut_t *pCut1,Sbd_Cut_t *pCut,int nCutSize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *pC;
  int c;
  int *pC1;
  int k;
  int *pC0;
  int i;
  int nSize1;
  int nSize0;
  int nCutSize_local;
  Sbd_Cut_t *pCut_local;
  Sbd_Cut_t *pCut1_local;
  Sbd_Cut_t *pCut0_local;
  
  uVar3 = *(uint *)&pCut0->field_0x14 >> 0x1c;
  uVar4 = *(uint *)&pCut1->field_0x14 >> 0x1c;
  if ((uVar3 == nCutSize) && (uVar4 == nCutSize)) {
    for (pC0._0_4_ = 0; (int)pC0 < (int)uVar3; pC0._0_4_ = (int)pC0 + 1) {
      if (pCut0->pLeaves[(int)pC0] != pCut1->pLeaves[(int)pC0]) {
        return 0;
      }
      pCut->pLeaves[(int)pC0] = pCut0->pLeaves[(int)pC0];
    }
    *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xfffffff | nCutSize << 0x1c;
    pCut->iFunc = -1;
    pCut->Sign = pCut0->Sign | pCut1->Sign;
    pCut0_local._4_4_ = 1;
  }
  else {
    pC._4_4_ = 0;
    pC1._4_4_ = 0;
    pC0._0_4_ = 0;
    iVar1 = pC._4_4_;
    iVar2 = pC1._4_4_;
    if (uVar3 == 0) {
LAB_00679763:
      pC1._4_4_ = iVar2;
      pC._4_4_ = iVar1;
      if (nCutSize + pC1._4_4_ < (int)(pC._4_4_ + uVar4)) {
        pCut0_local._4_4_ = 0;
      }
      else {
        while (pC1._4_4_ < (int)uVar4) {
          pCut->pLeaves[pC._4_4_] = pCut1->pLeaves[pC1._4_4_];
          pC._4_4_ = pC._4_4_ + 1;
          pC1._4_4_ = pC1._4_4_ + 1;
        }
        *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xfffffff | pC._4_4_ << 0x1c;
        pCut->iFunc = -1;
        pCut->Sign = pCut0->Sign | pCut1->Sign;
        pCut0_local._4_4_ = 1;
      }
    }
    else if (uVar4 == 0) {
LAB_006796ca:
      pC._4_4_ = iVar1;
      if (nCutSize + (int)pC0 < (int)(pC._4_4_ + uVar3)) {
        pCut0_local._4_4_ = 0;
      }
      else {
        while ((int)pC0 < (int)uVar3) {
          pCut->pLeaves[pC._4_4_] = pCut0->pLeaves[(int)pC0];
          pC._4_4_ = pC._4_4_ + 1;
          pC0._0_4_ = (int)pC0 + 1;
        }
        *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xfffffff | pC._4_4_ << 0x1c;
        pCut->iFunc = -1;
        pCut->Sign = pCut0->Sign | pCut1->Sign;
        pCut0_local._4_4_ = 1;
      }
    }
    else {
      for (; pC._4_4_ != nCutSize; pC._4_4_ = pC._4_4_ + 1) {
        if (pCut0->pLeaves[(int)pC0] < pCut1->pLeaves[pC1._4_4_]) {
          iVar5 = (int)pC0 + 1;
          pCut->pLeaves[pC._4_4_] = pCut0->pLeaves[(int)pC0];
          iVar1 = pC._4_4_ + 1;
          iVar2 = pC1._4_4_;
          pC0._0_4_ = iVar5;
          if ((int)uVar3 <= iVar5) goto LAB_00679763;
        }
        else {
          if (pCut1->pLeaves[pC1._4_4_] < pCut0->pLeaves[(int)pC0]) {
            pCut->pLeaves[pC._4_4_] = pCut1->pLeaves[pC1._4_4_];
          }
          else {
            iVar5 = (int)pC0 + 1;
            pCut->pLeaves[pC._4_4_] = pCut0->pLeaves[(int)pC0];
            iVar1 = pC._4_4_ + 1;
            iVar2 = pC1._4_4_ + 1;
            pC0._0_4_ = iVar5;
            if ((int)uVar3 <= iVar5) goto LAB_00679763;
          }
          iVar1 = pC._4_4_ + 1;
          if ((int)uVar4 <= pC1._4_4_ + 1) goto LAB_006796ca;
          pC1._4_4_ = pC1._4_4_ + 1;
        }
      }
      pCut0_local._4_4_ = 0;
    }
  }
  return pCut0_local._4_4_;
}

Assistant:

static inline int Sbd_CutMergeOrder( Sbd_Cut_t * pCut0, Sbd_Cut_t * pCut1, Sbd_Cut_t * pCut, int nCutSize )
{ 
    int nSize0   = pCut0->nLeaves;
    int nSize1   = pCut1->nLeaves;
    int i, * pC0 = pCut0->pLeaves;
    int k, * pC1 = pCut1->pLeaves;
    int c, * pC  = pCut->pLeaves;
    // the case of the largest cut sizes
    if ( nSize0 == nCutSize && nSize1 == nCutSize )
    {
        for ( i = 0; i < nSize0; i++ )
        {
            if ( pC0[i] != pC1[i] )  return 0;
            pC[i] = pC0[i];
        }
        pCut->nLeaves = nCutSize;
        pCut->iFunc = -1;
        pCut->Sign = pCut0->Sign | pCut1->Sign;
        return 1;
    }
    // compare two cuts with different numbers
    i = k = c = 0;
    if ( nSize0 == 0 ) goto FlushCut1;
    if ( nSize1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nCutSize ) return 0;
        if ( pC0[i] < pC1[k] )
        {
            pC[c++] = pC0[i++];
            if ( i >= nSize0 ) goto FlushCut1;
        }
        else if ( pC0[i] > pC1[k] )
        {
            pC[c++] = pC1[k++];
            if ( k >= nSize1 ) goto FlushCut0;
        }
        else
        {
            pC[c++] = pC0[i++]; k++;
            if ( i >= nSize0 ) goto FlushCut1;
            if ( k >= nSize1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSize0 > nCutSize + i ) return 0;
    while ( i < nSize0 )
        pC[c++] = pC0[i++];
    pCut->nLeaves = c;
    pCut->iFunc = -1;
    pCut->Sign = pCut0->Sign | pCut1->Sign;
    return 1;

FlushCut1:
    if ( c + nSize1 > nCutSize + k ) return 0;
    while ( k < nSize1 )
        pC[c++] = pC1[k++];
    pCut->nLeaves = c;
    pCut->iFunc = -1;
    pCut->Sign = pCut0->Sign | pCut1->Sign;
    return 1;
}